

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

bool __thiscall
testing::internal::
OnCallSpec<const_solitaire::piles::interfaces::TableauPile_&(solitaire::piles::PileId)>::Matches
          (OnCallSpec<const_solitaire::piles::interfaces::TableauPile_&(solitaire::piles::PileId)>
           *this,ArgumentTuple *args)

{
  bool bVar1;
  
  bVar1 = MatcherBase<solitaire::piles::PileId>::Matches
                    ((MatcherBase<solitaire::piles::PileId> *)(this + 0x10),(PileId *)args);
  if (bVar1) {
    bVar1 = MatcherBase<const_std::tuple<solitaire::piles::PileId>_&>::Matches
                      ((MatcherBase<const_std::tuple<solitaire::piles::PileId>_&> *)(this + 0x28),
                       args);
    return bVar1;
  }
  return false;
}

Assistant:

bool Matches(const ArgumentTuple& args) const {
    return TupleMatches(matchers_, args) && extra_matcher_.Matches(args);
  }